

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O1

void test_bson_build_child_array(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  long lVar4;
  undefined8 unaff_R14;
  bson_t b;
  bson_t child;
  undefined8 uStack_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 uStack_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 *puStack_da0;
  undefined1 *puStack_d98;
  undefined8 *puStack_d90;
  code *pcStack_d88;
  undefined8 uStack_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 uStack_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 uStack_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 uStack_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 uStack_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 uStack_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 *puStack_b30;
  undefined1 *puStack_b28;
  code *pcStack_b08;
  undefined8 uStack_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 uStack_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  char *pcStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [128];
  undefined1 auStack_900 [128];
  undefined1 auStack_880 [344];
  undefined1 *puStack_728;
  code *pcStack_708;
  bson_t bStack_700;
  bson_t abStack_680 [2];
  undefined1 *puStack_520;
  undefined8 uStack_518;
  code *pcStack_508;
  bson_t abStack_500 [2];
  undefined1 *puStack_398;
  undefined8 uStack_390;
  code *pcStack_388;
  undefined1 auStack_380 [368];
  bson_t *pbStack_210;
  code *pcStack_208;
  bson_t bStack_200;
  undefined1 local_180 [360];
  
  pbVar3 = &bStack_200;
  pcStack_208 = (code *)0x125207;
  bson_init(&bStack_200);
  pcStack_208 = (code *)0x125223;
  cVar1 = bson_append_array_begin(&bStack_200,"foo",0xffffffff,local_180);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x1252fe;
    test_bson_build_child_array_cold_1();
LAB_001252fe:
    pcStack_208 = (code *)0x125303;
    test_bson_build_child_array_cold_2();
LAB_00125303:
    pcStack_208 = (code *)0x125308;
    test_bson_build_child_array_cold_3();
LAB_00125308:
    pcStack_208 = (code *)0x12530d;
    test_bson_build_child_array_cold_4();
LAB_0012530d:
    pcStack_208 = (code *)0x125312;
    test_bson_build_child_array_cold_5();
  }
  else {
    pcStack_208 = (code *)0x125251;
    cVar1 = bson_append_utf8(local_180,"0",0xffffffff,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_001252fe;
    pcStack_208 = (code *)0x125269;
    cVar1 = bson_append_array_end(&bStack_200,local_180);
    if (cVar1 == '\0') goto LAB_00125303;
    pcStack_208 = (code *)0x125276;
    pbVar3 = (bson_t *)bson_new();
    pcStack_208 = (code *)0x12527e;
    unaff_R14 = bson_new();
    pcStack_208 = (code *)0x1252a2;
    cVar1 = bson_append_utf8(unaff_R14,"0",0xffffffff,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_00125308;
    pcStack_208 = (code *)0x1252bd;
    cVar1 = bson_append_array(pbVar3,"foo",0xffffffff,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012530d;
    pcStack_208 = (code *)0x1252c9;
    bson_destroy(unaff_R14);
    if (bStack_200.len == pbVar3->len) {
      pcStack_208 = (code *)0x1252e0;
      BSON_ASSERT_BSON_EQUAL(&bStack_200,pbVar3);
      pcStack_208 = (code *)0x1252e8;
      bson_destroy(&bStack_200);
      pcStack_208 = (code *)0x1252f0;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_208 = test_bson_count_keys;
  test_bson_build_child_array_cold_6();
  pcStack_388 = (code *)0x125332;
  pbStack_210 = pbVar3;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_380);
  pcStack_388 = (code *)0x125348;
  cVar1 = bson_append_int32(auStack_380,"0",0xffffffff,0);
  if (cVar1 == '\0') {
    pcStack_388 = (code *)0x1253a7;
    test_bson_count_keys_cold_1();
LAB_001253a7:
    pcStack_388 = (code *)0x1253ac;
    test_bson_count_keys_cold_2();
LAB_001253ac:
    pcStack_388 = (code *)0x1253b1;
    test_bson_count_keys_cold_3();
  }
  else {
    pcStack_388 = (code *)0x125365;
    cVar1 = bson_append_int32(auStack_380,"1",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_001253a7;
    pcStack_388 = (code *)0x125382;
    cVar1 = bson_append_int32(auStack_380,"2",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_001253ac;
    pcStack_388 = (code *)0x12538e;
    iVar2 = bson_count_keys(auStack_380);
    if (iVar2 == 3) {
      pcStack_388 = (code *)0x12539b;
      bson_destroy(auStack_380);
      return;
    }
  }
  pcStack_388 = test_bson_copy;
  test_bson_count_keys_cold_4();
  pcStack_508 = (code *)0x1253d3;
  puStack_398 = auStack_380;
  uStack_390 = unaff_R14;
  pcStack_388 = (code *)&pcStack_208;
  bson_init(abStack_500);
  pcStack_508 = (code *)0x1253ec;
  cVar1 = bson_append_int32(abStack_500,"foobar",0xffffffff,0x4d2);
  if (cVar1 != '\0') {
    pcStack_508 = (code *)0x1253fb;
    pbVar3 = (bson_t *)bson_copy(abStack_500);
    pcStack_508 = (code *)0x125409;
    BSON_ASSERT_BSON_EQUAL(abStack_500,pbVar3);
    pcStack_508 = (code *)0x125411;
    bson_destroy(pbVar3);
    pcStack_508 = (code *)0x125419;
    bson_destroy(abStack_500);
    return;
  }
  pcStack_508 = test_bson_copy_to;
  test_bson_copy_cold_1();
  pcStack_708 = (code *)0x125446;
  puStack_520 = (undefined1 *)abStack_500;
  uStack_518 = unaff_R14;
  pcStack_508 = (code *)&pcStack_388;
  bson_init(&bStack_700);
  pcStack_708 = (code *)0x12545f;
  cVar1 = bson_append_int32(&bStack_700,"foobar",0xffffffff,0x4d2);
  if (cVar1 != '\0') {
    pcStack_708 = (code *)0x12547d;
    bson_copy_to(&bStack_700,abStack_680);
    pcStack_708 = (code *)0x125488;
    BSON_ASSERT_BSON_EQUAL(&bStack_700,abStack_680);
    pcStack_708 = (code *)0x125490;
    bson_destroy(abStack_680);
    pcStack_708 = (code *)0x125498;
    bson_destroy(&bStack_700);
    pcStack_708 = (code *)0x1254a0;
    bson_init(&bStack_700);
    iVar2 = 1000;
    while( true ) {
      pcStack_708 = (code *)0x1254c2;
      cVar1 = bson_append_int32(&bStack_700,"foobar",0xffffffff,0x4d2);
      if (cVar1 == '\0') break;
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        pcStack_708 = (code *)0x1254e1;
        bson_copy_to(&bStack_700,abStack_680);
        pcStack_708 = (code *)0x1254ec;
        BSON_ASSERT_BSON_EQUAL(&bStack_700,abStack_680);
        pcStack_708 = (code *)0x1254f4;
        bson_destroy(abStack_680);
        pcStack_708 = (code *)0x1254fc;
        bson_destroy(&bStack_700);
        return;
      }
    }
    pcStack_708 = (code *)0x12550c;
    test_bson_copy_to_cold_2();
  }
  pcStack_708 = test_bson_copy_to_excluding_noinit;
  test_bson_copy_to_cold_1();
  pcStack_988 = (code *)0x125537;
  puStack_728 = (undefined1 *)&bStack_700;
  pcStack_708 = (code *)&pcStack_508;
  bson_init(auStack_880);
  pcStack_988 = (code *)0x125553;
  bson_append_int32(auStack_880,"a",1,1);
  pcStack_988 = (code *)0x12556f;
  bson_append_int32(auStack_880,"b",1,2);
  pcStack_988 = (code *)0x12557a;
  bson_init(auStack_980);
  pcStack_988 = (code *)0x12558c;
  bson_copy_to_excluding_noinit(auStack_880,auStack_980,"b",0);
  pcStack_988 = (code *)0x12559f;
  cVar1 = bson_iter_init_find(auStack_900,auStack_980,"a");
  if (cVar1 == '\0') {
    pcStack_988 = (code *)0x125604;
    test_bson_copy_to_excluding_noinit_cold_1();
LAB_00125604:
    pcStack_988 = (code *)0x125609;
    test_bson_copy_to_excluding_noinit_cold_4();
  }
  else {
    pcStack_988 = (code *)0x1255ba;
    cVar1 = bson_iter_init_find(auStack_900,auStack_980,"b");
    if (cVar1 != '\0') goto LAB_00125604;
    pcStack_988 = (code *)0x1255cb;
    iVar2 = bson_count_keys(auStack_880);
    if (iVar2 == 2) {
      pcStack_988 = (code *)0x1255d8;
      iVar2 = bson_count_keys(auStack_980);
      if (iVar2 == 1) {
        pcStack_988 = (code *)0x1255ea;
        bson_destroy(auStack_880);
        pcStack_988 = (code *)0x1255f2;
        bson_destroy(auStack_980);
        return;
      }
      goto LAB_0012560e;
    }
  }
  pcStack_988 = (code *)0x12560e;
  test_bson_copy_to_excluding_noinit_cold_2();
LAB_0012560e:
  pcStack_988 = test_bson_initializer;
  test_bson_copy_to_excluding_noinit_cold_3();
  pcStack_990 = "a";
  uStack_a90 = 0;
  uStack_a88 = 0;
  uStack_aa0 = 0;
  uStack_a98 = 0;
  uStack_ab0 = 0;
  uStack_aa8 = 0;
  uStack_ac0 = 0;
  uStack_ab8 = 0;
  uStack_ad0 = 0;
  uStack_ac8 = 0;
  uStack_ae0 = 0;
  uStack_ad8 = 0;
  uStack_af0 = 0;
  uStack_ae8 = 0;
  uStack_b00 = 0x500000003;
  uStack_af8 = 5;
  pcStack_b08 = (code *)0x125672;
  pcStack_988 = (code *)&pcStack_708;
  bson_append_bool(&uStack_b00,"foo",0xffffffff,1);
  if (uStack_b00._4_4_ != 5) {
    pcStack_b08 = (code *)0x125680;
    lVar4 = bson_get_data(&uStack_b00);
    if (*(char *)(lVar4 + 4) != '\0') {
      pcStack_b08 = (code *)0x12568e;
      bson_destroy(&uStack_b00);
      return;
    }
  }
  pcStack_b08 = test_bson_concat;
  test_bson_initializer_cold_1();
  uStack_c10 = 0;
  uStack_c08 = 0;
  uStack_c20 = 0;
  uStack_c18 = 0;
  uStack_c30 = 0;
  uStack_c28 = 0;
  uStack_c40 = 0;
  uStack_c38 = 0;
  uStack_c50 = 0;
  uStack_c48 = 0;
  uStack_c60 = 0;
  uStack_c58 = 0;
  uStack_c70 = 0;
  uStack_c68 = 0;
  uStack_c80 = 0x500000003;
  uStack_c78 = 5;
  uStack_c90 = 0;
  uStack_c88 = 0;
  uStack_ca0 = 0;
  uStack_c98 = 0;
  uStack_cb0 = 0;
  uStack_ca8 = 0;
  uStack_cc0 = 0;
  uStack_cb8 = 0;
  uStack_cd0 = 0;
  uStack_cc8 = 0;
  uStack_ce0 = 0;
  uStack_cd8 = 0;
  uStack_cf0 = 0;
  uStack_ce8 = 0;
  uStack_d00 = 0x500000003;
  uStack_cf8 = 5;
  uStack_d10 = 0;
  uStack_d08 = 0;
  uStack_d20 = 0;
  uStack_d18 = 0;
  uStack_d30 = 0;
  uStack_d28 = 0;
  uStack_d40 = 0;
  uStack_d38 = 0;
  uStack_d50 = 0;
  uStack_d48 = 0;
  uStack_d60 = 0;
  uStack_d58 = 0;
  uStack_d70 = 0;
  uStack_d68 = 0;
  uStack_d80 = 0x500000003;
  uStack_d78 = 5;
  pcStack_d88 = (code *)0x125771;
  puStack_b30 = (undefined1 *)&uStack_b00;
  puStack_b28 = auStack_980;
  pcStack_b08 = (code *)&pcStack_988;
  bson_append_int32(&uStack_c80,"abc",3,1);
  pcStack_d88 = (code *)0x12578d;
  bson_append_int32(&uStack_d00,"def",3,1);
  pcStack_d88 = (code *)0x125798;
  bson_concat(&uStack_c80,&uStack_d00);
  pcStack_d88 = (code *)0x1257ad;
  bson_append_int32(&uStack_d80,"abc",3,1);
  pcStack_d88 = (code *)0x1257c2;
  bson_append_int32(&uStack_d80,"def",3,1);
  pcStack_d88 = (code *)0x1257cd;
  iVar2 = bson_compare(&uStack_d80,&uStack_c80);
  if (iVar2 == 0) {
    pcStack_d88 = (code *)0x1257de;
    bson_destroy(&uStack_c80);
    pcStack_d88 = (code *)0x1257eb;
    bson_destroy(&uStack_d00);
    pcStack_d88 = (code *)0x1257f3;
    bson_destroy(&uStack_d80);
    return;
  }
  pcStack_d88 = test_bson_reinit;
  test_bson_concat_cold_1();
  uStack_e90 = 0;
  uStack_e88 = 0;
  uStack_ea0 = 0;
  uStack_e98 = 0;
  uStack_eb0 = 0;
  uStack_ea8 = 0;
  uStack_ec0 = 0;
  uStack_eb8 = 0;
  uStack_ed0 = 0;
  uStack_ec8 = 0;
  uStack_ee0 = 0;
  uStack_ed8 = 0;
  uStack_ef0 = 0;
  uStack_ee8 = 0;
  uStack_f00 = 0x500000003;
  uStack_ef8 = 5;
  iVar2 = 0;
  puStack_da0 = &uStack_c80;
  puStack_d98 = (undefined1 *)&uStack_d80;
  puStack_d90 = &uStack_d00;
  pcStack_d88 = (code *)&pcStack_b08;
  do {
    bson_append_int32(&uStack_f00,"",0,iVar2);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 1000);
  bson_reinit(&uStack_f00);
  iVar2 = 0;
  do {
    bson_append_int32(&uStack_f00,"",0,iVar2);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 1000);
  bson_destroy(&uStack_f00);
  return;
}

Assistant:

static void
test_bson_build_child_array (void)
{
   bson_t b;
   bson_t child;
   bson_t *b2;
   bson_t *child2;

   bson_init (&b);
   BSON_ASSERT (bson_append_array_begin (&b, "foo", -1, &child));
   BSON_ASSERT (bson_append_utf8 (&child, "0", -1, "baz", -1));
   BSON_ASSERT (bson_append_array_end (&b, &child));

   b2 = bson_new ();
   child2 = bson_new ();
   BSON_ASSERT (bson_append_utf8 (child2, "0", -1, "baz", -1));
   BSON_ASSERT (bson_append_array (b2, "foo", -1, child2));
   bson_destroy (child2);

   BSON_ASSERT (b.len == b2->len);
   BSON_ASSERT_BSON_EQUAL (&b, b2);

   bson_destroy (&b);
   bson_destroy (b2);
}